

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File_Utilities.cpp
# Opt level: O2

istream * Nova::File_Utilities::Safe_Open_Input(string *filename,bool binary)

{
  ifstream *this;
  undefined7 in_register_00000031;
  
  this = (ifstream *)operator_new(0x208);
  std::ifstream::ifstream
            (this,(filename->_M_dataplus)._M_p,
             (int)CONCAT71(in_register_00000031,binary) * 4 + _S_in);
  return (istream *)this;
}

Assistant:

std::istream* Safe_Open_Input(const std::string& filename,bool binary)
    {
        std::ios_base::openmode flags=std::ios::in;
        if(binary) flags|=std::ios::binary;
        std::istream* input=new std::ifstream(filename.c_str(),flags);
        if(input!=nullptr) return input;
        std::cerr<<"Can't open "<<filename<<" for read "<<(binary?"binary":"")<<std::endl;
        exit(0);
    }